

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void * lua_upvalueid(lua_State *L,int fidx,int n)

{
  TValue *pTVar1;
  byte bVar2;
  lua_CFunction p_Var3;
  
  pTVar1 = index2value(L,fidx);
  bVar2 = pTVar1->tt_ & 0x3f;
  if (bVar2 == 0x26) {
    if ((0 < n) && ((uint)n <= (uint)(byte)(pTVar1->value_).f[10])) {
      return (pTVar1->value_).f + (ulong)(n - 1) * 0x10 + 0x20;
    }
  }
  else if (bVar2 == 6) {
    pTVar1 = index2value(L,fidx);
    p_Var3 = (lua_CFunction)&getupvalref_nullup;
    if ((0 < n) && (n <= *(int *)(*(long *)((pTVar1->value_).f + 0x18) + 0x10))) {
      p_Var3 = (pTVar1->value_).f + (ulong)(n - 1) * 8 + 0x20;
    }
    return *(void **)p_Var3;
  }
  return (void *)0x0;
}

Assistant:

LUA_API void *lua_upvalueid (lua_State *L, int fidx, int n) {
  TValue *fi = index2value(L, fidx);
  switch (ttypetag(fi)) {
    case LUA_VLCL: {  /* lua closure */
      return *getupvalref(L, fidx, n, NULL);
    }
    case LUA_VCCL: {  /* C closure */
      CClosure *f = clCvalue(fi);
      if (1 <= n && n <= f->nupvalues)
        return &f->upvalue[n - 1];
      /* else */
    }  /* FALLTHROUGH */
    case LUA_VLCF:
      return NULL;  /* light C functions have no upvalues */
    default: {
      api_check(L, 0, "function expected");
      return NULL;
    }
  }
}